

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O3

int inittcpcli(SOCKET *pSock,char *address,char *port)

{
  int iVar1;
  in_addr_t iVar2;
  int iVar3;
  sockaddr local_40;
  
  iVar3 = 1;
  iVar1 = socket(2,1,6);
  *pSock = iVar1;
  if (iVar1 != -1) {
    local_40.sa_family = 10;
    local_40.sa_data[0] = '\0';
    local_40.sa_data[1] = '\0';
    local_40.sa_data[2] = '\0';
    local_40.sa_data[3] = '\0';
    local_40.sa_data[4] = '\0';
    local_40.sa_data[5] = '\0';
    iVar3 = 0;
    local_40.sa_data[6] = '\0';
    local_40.sa_data[7] = '\0';
    local_40.sa_data[8] = '\0';
    local_40.sa_data[9] = '\0';
    local_40.sa_data[10] = '\0';
    local_40.sa_data[0xb] = '\0';
    local_40.sa_data[0xc] = '\0';
    local_40.sa_data[0xd] = '\0';
    setsockopt(iVar1,1,0x15,&local_40,0x10);
    setsockopt(iVar1,1,0x14,&local_40,0x10);
    local_40.sa_data[6] = '\0';
    local_40.sa_data[7] = '\0';
    local_40.sa_data[8] = '\0';
    local_40.sa_data[9] = '\0';
    local_40.sa_data[10] = '\0';
    local_40.sa_data[0xb] = '\0';
    local_40.sa_data[0xc] = '\0';
    local_40.sa_data[0xd] = '\0';
    local_40.sa_family = 2;
    iVar1 = atoi(port);
    local_40.sa_data._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
    iVar2 = inet_addr(address);
    local_40.sa_data._2_4_ = iVar2;
    iVar1 = connect(*pSock,&local_40,0x10);
    if (iVar1 != 0) {
      close(*pSock);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

inline int inittcpcli(SOCKET* pSock, char* address, char* port)
{
	struct sockaddr_in sa;

#ifdef _WIN32
	WSADATA wsaData;
#endif // _WIN32

#ifdef _WIN32
	// Initiate use of the Winsock 2 DLL (WS2_32.dll) by a process.
	if (WSAStartup(MAKEWORD(2,2), &wsaData) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"WSAStartup failed. ", 
			address, port));
		return EXIT_FAILURE;
	}
#endif // _WIN32

	// Create a TCP IPv4 socket.
	*pSock = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
	if (*pSock == INVALID_SOCKET)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"socket failed. ", 
			address, port));
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	// Configure timeouts for send and recv.
	if (setsockettimeouts(*pSock, DEFAULT_SOCK_TIMEOUT) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"setsockettimeouts failed. ", 
			address, port));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	memset(&sa, 0, sizeof(sa));

	// The sockaddr_in structure specifies the address family,
	// IP address, and port of the server to be connected to.
	sa.sin_family = AF_INET;
	sa.sin_port = htons((unsigned short)atoi(port));
	sa.sin_addr.s_addr = inet_addr(address);

	// Connect to server.
	if (connect(*pSock, (struct sockaddr*)&sa, sizeof(sa)) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_ERROR_OSNET(("inittcpcli error (%s) : %s(address=%s, port=%s)\n", 
			strtime_m(), 
			"connect failed. ", 
			address, port));
		closesocket(*pSock);
#ifdef _WIN32
		WSACleanup();
#endif // _WIN32
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}